

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

LY_ERR lyds_merge_nodes1(lyd_node **first_dst,lyd_node **leader_dst,lyd_meta *root_meta_dst,
                        rb_node *rbt_dst,lyd_node **first_src,lyd_node *leader_src,lyd_node **next_p
                        )

{
  lysc_node *plVar1;
  lyd_node *plVar2;
  bool bVar3;
  lyd_value_lyds_tree *_lt;
  lysc_node *schema;
  lyd_node *next;
  lyd_node *iter;
  rb_node *rbn;
  lyd_node *plStack_38;
  LY_ERR ret;
  lyd_node *leader_src_local;
  lyd_node **first_src_local;
  rb_node *rbt_dst_local;
  lyd_meta *root_meta_dst_local;
  lyd_node **leader_dst_local;
  lyd_node **first_dst_local;
  
  plVar1 = leader_src->schema;
  next = leader_src;
  plStack_38 = leader_src;
  leader_src_local = (lyd_node *)first_src;
  first_src_local = (lyd_node **)rbt_dst;
  rbt_dst_local = (rb_node *)root_meta_dst;
  root_meta_dst_local = (lyd_meta *)leader_dst;
  leader_dst_local = first_dst;
  while( true ) {
    bVar3 = false;
    if (next != (lyd_node *)0x0) {
      bVar3 = next->schema == plVar1;
    }
    if ((!bVar3) ||
       (rbn._4_4_ = rb_insert(next,(rb_node **)&first_src_local,(rb_node **)&iter),
       rbn._4_4_ != LY_SUCCESS)) break;
    plVar2 = next->next;
    lyd_unlink_ignore_lyds((lyd_node **)leader_src_local,next);
    lyds_link_data_node(leader_dst_local,&root_meta_dst_local->parent,next,(lyd_meta *)rbt_dst_local
                        ,(rb_node *)iter);
    lyd_insert_hash(next);
    next = plVar2;
  }
  *next_p = next;
  rbt_dst_local[1].left = (rb_node *)first_src_local;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyds_merge_nodes1(struct lyd_node **first_dst, struct lyd_node **leader_dst, struct lyd_meta *root_meta_dst,
        struct rb_node *rbt_dst, struct lyd_node **first_src, struct lyd_node *leader_src, struct lyd_node **next_p)
{
    LY_ERR ret;
    struct rb_node *rbn;
    struct lyd_node *iter, *next;
    const struct lysc_node *schema;

    schema = leader_src->schema;
    for (iter = leader_src; iter && (iter->schema == schema); iter = next) {
        ret = rb_insert(iter, &rbt_dst, &rbn);
        if (ret) {
            /* allocation failed, @p next_p must refer to failed node */
            break;
        }
        next = iter->next;
        lyd_unlink_ignore_lyds(first_src, iter);
        lyds_link_data_node(first_dst, leader_dst, iter, root_meta_dst, rbn);
        lyd_insert_hash(iter);
    }
    *next_p = iter;

    RBT_SET(root_meta_dst, rbt_dst);

    return LY_SUCCESS;
}